

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
           *this,align_spec *spec,inf_or_nan_writer *f)

{
  char cVar1;
  char *pcVar2;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> bVar3;
  ulong uVar4;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = (ulong)spec->width_;
  cVar1 = f->sign;
  uVar7 = 4 - (ulong)(cVar1 == '\0');
  uVar4 = uVar6 - uVar7;
  if (uVar6 < uVar7 || uVar4 == 0) {
    if (cVar1 != '\0') {
      *(long *)this = *(long *)this + 1;
    }
  }
  else {
    bVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *
             )&spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      lVar8 = *(long *)this + (uVar4 >> 1);
      bVar5 = bVar3;
      if (uVar4 < 2) {
        bVar5 = SUB41(*(undefined4 *)(this + 8),0);
      }
      *(long *)this = lVar8;
      this[8] = bVar5;
      if (f->sign != '\0') {
        *(long *)this = lVar8 + 1;
      }
      pcVar2 = f->str;
      if (uVar6 == uVar7) {
        bVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                  *)(pcVar2 + 2);
      }
      *(char **)this = pcVar2 + (uVar4 - (uVar4 >> 1)) + (*(long *)this - (long)pcVar2) + 3;
      this[8] = bVar3;
      return;
    }
    if (spec->align_ != ALIGN_RIGHT) {
      if (cVar1 != '\0') {
        *(long *)this = *(long *)this + 1;
      }
      pcVar2 = f->str;
      if (uVar6 == uVar7) {
        bVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                  *)(pcVar2 + 2);
      }
      *(char **)this = pcVar2 + uVar4 + (*(long *)this - (long)pcVar2) + 3;
      this[8] = bVar3;
      return;
    }
    lVar8 = *(long *)this;
    if (uVar6 == uVar7) {
      bVar3 = SUB41(*(undefined4 *)(this + 8),0);
    }
    *(ulong *)this = uVar4 + lVar8;
    this[8] = bVar3;
    if (f->sign != '\0') {
      *(ulong *)this = uVar4 + lVar8 + 1;
    }
  }
  pcVar2 = f->str;
  bVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *)
           (pcVar2 + 2);
  *(char **)this = pcVar2 + (*(long *)this - (long)pcVar2) + 3;
  this[8] = bVar3;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }